

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O2

_Bool cert_expr_match_str(char *expression,char *hostname,uint port)

{
  _Bool _Var1;
  ExprNode *en;
  ptrlen expr;
  
  expr = ptrlen_from_asciz(expression);
  en = parse(expr,(char **)0x0,(ptrlen *)0x0);
  if (en == (ExprNode *)0x0) {
    _Var1 = false;
  }
  else {
    _Var1 = eval(en,hostname,port);
    exprnode_free(en);
  }
  return _Var1;
}

Assistant:

bool cert_expr_match_str(const char *expression,
                         const char *hostname, unsigned port)
{
    ExprNode *en = parse(ptrlen_from_asciz(expression), NULL, NULL);
    if (!en)
        return false;

    bool matched = eval(en, hostname, port);
    exprnode_free(en);
    return matched;
}